

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

void stbtt__v_prefilter(uchar *pixels,int w,int h,int stride_in_bytes,uint kernel_width)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  byte *pbVar9;
  long lVar10;
  uchar buffer [8];
  
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  lVar10 = (long)(int)(h - kernel_width);
  lVar6 = (long)stride_in_bytes;
  iVar3 = 0;
  if (w < 1) {
    w = 0;
  }
  do {
    if (iVar3 == w) {
      return;
    }
    memset(buffer,0,(ulong)kernel_width);
    switch(kernel_width) {
    case 2:
      uVar5 = 0;
      pbVar9 = pixels;
      for (uVar7 = 0; (long)uVar7 <= lVar10; uVar7 = uVar7 + 1) {
        bVar1 = *pbVar9;
        bVar2 = buffer[(uint)uVar7 & 7];
        buffer[(uint)uVar7 + 2 & 7] = bVar1;
        uVar4 = (int)uVar5 + ((uint)bVar1 - (uint)bVar2);
        uVar5 = (ulong)uVar4;
        *pbVar9 = (byte)(uVar4 >> 1);
        pbVar9 = pbVar9 + lVar6;
      }
      break;
    case 3:
      uVar5 = 0;
      pbVar9 = pixels;
      for (uVar7 = 0; (long)uVar7 <= lVar10; uVar7 = uVar7 + 1) {
        bVar1 = *pbVar9;
        bVar2 = buffer[(uint)uVar7 & 7];
        buffer[(uint)uVar7 + 3 & 7] = bVar1;
        uVar5 = (ulong)((int)uVar5 + ((uint)bVar1 - (uint)bVar2));
        *pbVar9 = (byte)(uVar5 / 3);
        pbVar9 = pbVar9 + lVar6;
      }
      break;
    case 4:
      uVar5 = 0;
      pbVar9 = pixels;
      for (uVar7 = 0; (long)uVar7 <= lVar10; uVar7 = uVar7 + 1) {
        bVar1 = *pbVar9;
        uVar8 = (ulong)((uint)uVar7 & 7);
        buffer[uVar8 ^ 4] = bVar1;
        uVar4 = (int)uVar5 + ((uint)bVar1 - (uint)buffer[uVar8]);
        uVar5 = (ulong)uVar4;
        *pbVar9 = (byte)(uVar4 >> 2);
        pbVar9 = pbVar9 + lVar6;
      }
      break;
    case 5:
      uVar5 = 0;
      pbVar9 = pixels;
      for (uVar7 = 0; (long)uVar7 <= lVar10; uVar7 = uVar7 + 1) {
        bVar1 = *pbVar9;
        bVar2 = buffer[(uint)uVar7 & 7];
        buffer[(uint)uVar7 + 5 & 7] = bVar1;
        uVar5 = (ulong)((int)uVar5 + ((uint)bVar1 - (uint)bVar2));
        *pbVar9 = (byte)(uVar5 / 5);
        pbVar9 = pbVar9 + lVar6;
      }
      break;
    default:
      uVar5 = 0;
      pbVar9 = pixels;
      for (uVar7 = 0; (long)uVar7 <= lVar10; uVar7 = uVar7 + 1) {
        bVar1 = *pbVar9;
        bVar2 = buffer[(uint)uVar7 & 7];
        buffer[kernel_width + (uint)uVar7 & 7] = bVar1;
        uVar4 = (int)uVar5 + ((uint)bVar1 - (uint)bVar2);
        uVar5 = (ulong)uVar4;
        *pbVar9 = (byte)(uVar4 / kernel_width);
        pbVar9 = pbVar9 + lVar6;
      }
    }
    pbVar9 = pixels + uVar7 * lVar6;
    for (uVar7 = uVar7 & 0xffffffff; (long)uVar7 < (long)h; uVar7 = uVar7 + 1) {
      if (*pbVar9 != 0) {
        __assert_fail("pixels[i*stride_in_bytes] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                      ,0x1020,
                      "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)");
      }
      uVar4 = (int)uVar5 - (uint)buffer[(uint)uVar7 & 7];
      uVar5 = (ulong)uVar4;
      *pbVar9 = (byte)(uVar4 / kernel_width);
      pbVar9 = pbVar9 + lVar6;
    }
    pixels = pixels + 1;
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

static void stbtt__v_prefilter(unsigned char *pixels, int w, int h, int stride_in_bytes, unsigned int kernel_width)
{
   unsigned char buffer[STBTT_MAX_OVERSAMPLE];
   int safe_h = h - kernel_width;
   int j;
   STBTT_memset(buffer, 0, STBTT_MAX_OVERSAMPLE); // suppress bogus warning from VS2013 -analyze
   for (j=0; j < w; ++j) {
      int i;
      unsigned int total;
      STBTT_memset(buffer, 0, kernel_width);

      total = 0;

      // make kernel_width a constant in common cases so compiler can optimize out the divide
      switch (kernel_width) {
         case 2:
            for (i=0; i <= safe_h; ++i) {
               total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
               pixels[i*stride_in_bytes] = (unsigned char) (total / 2);
            }
            break;
         case 3:
            for (i=0; i <= safe_h; ++i) {
               total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
               pixels[i*stride_in_bytes] = (unsigned char) (total / 3);
            }
            break;
         case 4:
            for (i=0; i <= safe_h; ++i) {
               total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
               pixels[i*stride_in_bytes] = (unsigned char) (total / 4);
            }
            break;
         case 5:
            for (i=0; i <= safe_h; ++i) {
               total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
               pixels[i*stride_in_bytes] = (unsigned char) (total / 5);
            }
            break;
         default:
            for (i=0; i <= safe_h; ++i) {
               total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
               pixels[i*stride_in_bytes] = (unsigned char) (total / kernel_width);
            }
            break;
      }

      for (; i < h; ++i) {
         STBTT_assert(pixels[i*stride_in_bytes] == 0);
         total -= buffer[i & STBTT__OVER_MASK];
         pixels[i*stride_in_bytes] = (unsigned char) (total / kernel_width);
      }

      pixels += 1;
   }
}